

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_encode_ciphertext(uint16_t *ciphertext,uint p,uint q,BinarySink *bs)

{
  uint16_t uVar1;
  uint64_t qrecip_00;
  uint16_t *rs_in;
  NTRUEncodeSchedule *sched;
  ulong uVar2;
  short sVar3;
  uint uVar4;
  uint64_t qrecip;
  uint16_t q_00;
  ulong factor1;
  
  qrecip_00 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0);
  factor1 = (ulong)p;
  rs_in = (uint16_t *)safemalloc(factor1,2,0);
  q_00 = (uint16_t)q;
  if (p != 0) {
    uVar2 = 0;
    do {
      uVar4 = (uint)ciphertext[uVar2] + (((q >> 1) + 1) / 3) * 3;
      sVar3 = (short)uVar4 - (short)(qrecip_00 * uVar4 >> 0x30) * q_00;
      uVar4 = q;
      if ((short)(sVar3 - q_00) < 0) {
        uVar4 = 0;
      }
      rs_in[uVar2] = sVar3 - (short)uVar4;
      uVar2 = uVar2 + 1;
    } while (factor1 != uVar2);
  }
  uVar1 = invert(3,q_00,qrecip_00);
  if (p != 0) {
    uVar2 = 0;
    do {
      sVar3 = (short)((uint)rs_in[uVar2] * (uint)uVar1) -
              (short)(qrecip_00 * ((uint)rs_in[uVar2] * (uint)uVar1) >> 0x30) * q_00;
      uVar4 = q;
      if ((short)(sVar3 - q_00) < 0) {
        uVar4 = 0;
      }
      rs_in[uVar2] = sVar3 - (short)uVar4;
      uVar2 = uVar2 + 1;
    } while (factor1 != uVar2);
  }
  sched = ntru_encode_ciphertext_schedule(p,q);
  ntru_encode(sched,rs_in,bs);
  safefree(sched->ops);
  safefree(sched);
  smemclr(rs_in,factor1 * 2);
  safefree(rs_in);
  return;
}

Assistant:

void ntru_encode_ciphertext(const uint16_t *ciphertext, unsigned p, unsigned q,
                            BinarySink *bs)
{
    SETUP;

    /*
     * Bias the ciphertext, and scale down by 1/3, which we do by
     * modular multiplication by the inverse of 3 mod q. (That only
     * works if we know the inputs are all _exact_ multiples of 3
     * - but we do!)
     */
    uint16_t *biased_ciphertext = snewn(p, uint16_t);
    ntru_bias(biased_ciphertext, ciphertext, 3 * ciphertext_bias(q), p, q);
    ntru_scale(biased_ciphertext, biased_ciphertext, INVERT(3), p, q);

    /* Encode. */
    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);
    ntru_encode(sched, biased_ciphertext, bs);
    ntru_encode_schedule_free(sched);

    ring_free(biased_ciphertext, p);
}